

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void slang::ast::RandSeqProductionSymbol::createRuleVariables
               (RsRuleSyntax *syntax,Scope *scope,
               SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  uint uVar1;
  pointer ppRVar2;
  Compilation *this;
  RandSeqProductionSymbol *pRVar3;
  DeferredSourceRange sourceRange;
  VariableSymbol *pVVar4;
  Type *pTVar5;
  RsIfElseSyntax *ries;
  DeclaredType *this_00;
  iterator __begin2;
  anon_class_16_2_7e13625a countProd;
  SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  prodMap;
  VariableLifetime local_16c;
  Scope *local_168;
  PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> local_160;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_158;
  Token local_150;
  SourceLocation local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  uintptr_t local_128;
  iterator local_118;
  Scope *local_108;
  SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  *local_100;
  undefined1 local_f8 [200];
  
  local_158 = results;
  SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  ::SmallMap((SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
              *)local_f8);
  ppRVar2 = (syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>._M_ptr
  ;
  local_168 = scope;
  local_160.value = (uintptr_t)syntax;
  local_108 = scope;
  local_100 = (SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
               *)local_f8;
  if (ppRVar2 !=
      ppRVar2 + (syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.
                _M_extent._M_extent_value) {
    (*(code *)(&DAT_0044b900 +
              *(int *)(&DAT_0044b900 + (ulong)(((*ppRVar2)->super_SyntaxNode).kind - RsCase) * 4)))
              ();
    return;
  }
  this = scope->compilation;
  local_118 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
              ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
                       *)(local_f8 + 0x88));
  while (local_118.p_ != (table_element_pointer)0x0) {
    pRVar3 = (local_118.p_)->first;
    uVar1 = (local_118.p_)->second;
    local_150 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)local_160.value);
    local_140 = parsing::Token::location(&local_150);
    local_16c = Automatic;
    pVVar4 = BumpAllocator::
             emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation,slang::ast::VariableLifetime>
                       (&this->super_BumpAllocator,&(pRVar3->super_Symbol).name,&local_140,
                        &local_16c);
    *(byte *)&(pVVar4->flags).m_bits = (byte)(pVVar4->flags).m_bits | 3;
    this_00 = &pRVar3->declaredReturnType;
    if (uVar1 == 1) {
      pTVar5 = DeclaredType::getType(this_00);
    }
    else {
      pTVar5 = DeclaredType::getType(this_00);
      local_138 = 0;
      uStack_130 = 0;
      local_128 = local_160.value;
      sourceRange.node.value = local_160.value;
      sourceRange.range = (SourceRange)ZEXT816(0);
      pTVar5 = FixedSizeUnpackedArrayType::fromDim
                         (local_168,pTVar5,(ConstantRange)(((ulong)uVar1 << 0x20) + 1),sourceRange);
    }
    (pVVar4->super_ValueSymbol).declaredType.type = pTVar5;
    local_150._0_8_ = pVVar4;
    SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
              ((SmallVectorBase<slang::ast::Symbol_const*> *)local_158,(Symbol **)&local_150);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
    ::increment(&local_118);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
                 *)(local_f8 + 0x88));
  return;
}

Assistant:

void RandSeqProductionSymbol::createRuleVariables(const RsRuleSyntax& syntax, const Scope& scope,
                                                  SmallVectorBase<const Symbol*>& results) {
    SmallMap<const RandSeqProductionSymbol*, uint32_t, 8> prodMap;
    auto countProd = [&](const RsProdItemSyntax& item) {
        auto symbol = Lookup::unqualified(scope, item.name.valueText(),
                                          LookupFlags::AllowDeclaredAfter);
        if (symbol && symbol->kind == SymbolKind::RandSeqProduction) {
            auto& prod = symbol->as<RandSeqProductionSymbol>();
            auto& type = prod.getReturnType();
            if (!type.isVoid()) {
                auto [it, inserted] = prodMap.emplace(&prod, 1);
                if (!inserted)
                    it->second++;
            }
        }
    };

    for (auto p : syntax.prods) {
        switch (p->kind) {
            case SyntaxKind::RsProdItem:
                countProd(p->as<RsProdItemSyntax>());
                break;
            case SyntaxKind::RsCodeBlock:
                break;
            case SyntaxKind::RsIfElse: {
                auto& ries = p->as<RsIfElseSyntax>();
                countProd(*ries.ifItem);
                if (ries.elseClause)
                    countProd(*ries.elseClause->item);
                break;
            }
            case SyntaxKind::RsRepeat:
                countProd(*p->as<RsRepeatSyntax>().item);
                break;
            case SyntaxKind::RsCase:
                for (auto item : p->as<RsCaseSyntax>().items) {
                    switch (item->kind) {
                        case SyntaxKind::StandardRsCaseItem:
                            countProd(*item->as<StandardRsCaseItemSyntax>().item);
                            break;
                        case SyntaxKind::DefaultRsCaseItem:
                            countProd(*item->as<DefaultRsCaseItemSyntax>().item);
                            break;
                        default:
                            SLANG_UNREACHABLE;
                    }
                }
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    auto& comp = scope.getCompilation();
    for (auto [symbol, count] : prodMap) {
        auto var = comp.emplace<VariableSymbol>(symbol->name, syntax.getFirstToken().location(),
                                                VariableLifetime::Automatic);
        var->flags |= VariableFlags::Const | VariableFlags::CompilerGenerated;

        if (count == 1) {
            var->setType(symbol->getReturnType());
        }
        else {
            ConstantRange range{1, int32_t(count)};
            var->setType(
                FixedSizeUnpackedArrayType::fromDim(scope, symbol->getReturnType(), range, syntax));
        }

        results.push_back(var);
    }
}